

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O0

void decompressBlockETC21BitAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alphaimg,int width,int height,
               int startx,int starty,int channelsRGB)

{
  undefined1 uVar1;
  undefined1 uVar2;
  byte bVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  uint8 *in_RCX;
  uint8 *in_RDX;
  uint in_ESI;
  uint in_EDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int y_1;
  int x_1;
  uint block57_part2_1;
  uint block57_part1_1;
  uint block58_part2_1;
  uint block58_part1_1;
  uint block59_part2_1;
  uint block59_part1_1;
  int y;
  int x;
  uint block57_part2;
  uint block57_part1;
  uint block58_part2;
  uint block58_part1;
  uint block59_part2;
  uint block59_part1;
  int channelsA;
  char blue;
  char green;
  char red;
  char diff [3];
  char color1 [3];
  int diffbit;
  int local_74;
  int local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  int iVar10;
  int in_stack_ffffffffffffffb0;
  int iVar11;
  uint in_stack_ffffffffffffffb4;
  uint in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffbc;
  uint in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint in_stack_ffffffffffffffc8;
  int iVar12;
  undefined3 in_stack_ffffffffffffffd0;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  
  if (in_stack_00000018 == 3) {
    iVar12 = 1;
  }
  else {
    iVar12 = 4;
    in_RCX = in_RDX + 3;
  }
  uVar2 = (undefined1)(in_EDI >> 8);
  uVar1 = (undefined1)(in_EDI >> 0x10);
  bVar3 = (byte)(in_EDI >> 0x18);
  if ((in_EDI >> 1 & 1) == 0) {
    uVar13 = (CONCAT11(uVar1,bVar3) & 0xff07) & 0x7ff;
    uVar15 = CONCAT31(CONCAT12((char)(in_EDI >> 0xb),CONCAT11((char)(in_EDI >> 0x13),bVar3 >> 3)),
                      uVar2) & 0x1f1fff07;
    cVar9 = (char)(uVar13 >> 8) << 5;
    cVar4 = (char)((char)uVar13 << 5) >> 5;
    cVar5 = cVar9 >> 5;
    cVar6 = (char)((char)uVar15 << 5) >> 5;
    cVar7 = (char)(uVar15 >> 8) + cVar4;
    cVar8 = (char)(uVar15 >> 0x10) + cVar5;
    uVar14 = CONCAT31(CONCAT21((short)(CONCAT13(cVar5,(uint3)CONCAT11(cVar9,cVar4) << 0x10) >> 0x10)
                               ,cVar7),cVar8);
    cVar9 = (char)(uVar15 >> 0x18) + cVar6;
    uVar13 = CONCAT13(cVar9,in_stack_ffffffffffffffd0);
    if ((cVar7 < '\0') || ('\x1f' < cVar7)) {
      unstuff59bits(in_EDI,in_ESI,(uint *)&stack0xffffffffffffffa8,&local_5c);
      decompressBlockTHUMB59TAlphaC
                (uVar14,uVar13,(uint8 *)CONCAT44(iVar12,in_stack_ffffffffffffffc8),
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_R9D,(int)in_RCX,(int)in_RDX)
      ;
    }
    else if ((cVar8 < '\0') || ('\x1f' < cVar8)) {
      unstuff58bits(in_EDI,in_ESI,&local_60,&local_64);
      decompressBlockTHUMB58HAlphaC
                (uVar14,uVar13,(uint8 *)CONCAT44(iVar12,in_stack_ffffffffffffffc8),
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,in_R9D,(int)in_RCX,(int)in_RDX)
      ;
    }
    else if ((cVar9 < '\0') || ('\x1f' < cVar9)) {
      unstuff57bits(in_EDI,in_ESI,&local_68,&local_6c);
      decompressBlockPlanar57c
                (local_68,local_6c,in_RDX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,
                 in_stack_00000018);
      for (local_70 = in_stack_00000008; local_70 < in_stack_00000008 + 4; local_70 = local_70 + 1)
      {
        for (local_74 = in_stack_00000010; local_74 < in_stack_00000010 + 4; local_74 = local_74 + 1
            ) {
          in_RCX[iVar12 * (local_70 + local_74 * in_R8D)] = 0xff;
        }
      }
    }
    else {
      decompressBlockDifferentialWithAlphaC
                (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,uVar13,
                 CONCAT31((int3)(uVar15 >> 8),cVar6),in_R9D);
    }
  }
  else {
    uVar13 = (CONCAT11(uVar1,bVar3) & 0xff07) & 0x7ff;
    uVar15 = CONCAT31(CONCAT12((char)(in_EDI >> 0xb),CONCAT11((char)(in_EDI >> 0x13),bVar3 >> 3)),
                      uVar2) & 0x1f1fff07;
    cVar9 = (char)(uVar13 >> 8) << 5;
    cVar4 = (char)((char)uVar13 << 5) >> 5;
    cVar5 = cVar9 >> 5;
    cVar8 = (char)((char)uVar15 << 5) >> 5;
    iVar10 = CONCAT31((int3)(uVar15 >> 8),cVar8);
    cVar6 = (char)(uVar15 >> 8) + cVar4;
    cVar7 = (char)(uVar15 >> 0x10) + cVar5;
    uVar14 = CONCAT31(CONCAT21((short)(CONCAT13(cVar5,(uint3)CONCAT11(cVar9,cVar4) << 0x10) >> 0x10)
                               ,cVar6),cVar7);
    cVar8 = (char)(uVar15 >> 0x18) + cVar8;
    uVar13 = CONCAT13(cVar8,in_stack_ffffffffffffffd0);
    iVar11 = in_stack_00000008;
    if ((cVar6 < '\0') || ('\x1f' < cVar6)) {
      unstuff59bits(in_EDI,in_ESI,(uint *)&stack0xffffffffffffffc8,(uint *)&stack0xffffffffffffffc4)
      ;
      decompressBlockTHUMB59Tc
                (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,
                 uVar13,iVar10);
    }
    else if ((cVar7 < '\0') || ('\x1f' < cVar7)) {
      unstuff58bits(in_EDI,in_ESI,(uint *)&stack0xffffffffffffffc0,(uint *)&stack0xffffffffffffffbc)
      ;
      decompressBlockTHUMB58Hc
                (uVar14,uVar13,(uint8 *)CONCAT44(iVar12,in_stack_ffffffffffffffc8),
                 in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                 in_R9D,(int)in_RCX);
    }
    else if ((cVar8 < '\0') || ('\x1f' < cVar8)) {
      unstuff57bits(in_EDI,in_ESI,(uint *)&stack0xffffffffffffffb8,(uint *)&stack0xffffffffffffffb4)
      ;
      decompressBlockPlanar57c
                (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_RDX,in_R8D,in_R9D,
                 in_stack_00000008,in_stack_00000010,in_stack_00000018);
    }
    else {
      decompressBlockDifferentialWithAlphaC
                (in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 (uint8 *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                 in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8,uVar13,iVar10,in_R9D);
    }
    for (; iVar10 = in_stack_00000010, iVar11 < in_stack_00000008 + 4; iVar11 = iVar11 + 1) {
      for (; iVar10 < in_stack_00000010 + 4; iVar10 = iVar10 + 1) {
        in_RCX[iVar12 * (iVar11 + iVar10 * in_R8D)] = 0xff;
      }
    }
  }
  return;
}

Assistant:

void decompressBlockETC21BitAlphaC(unsigned int block_part1, unsigned int block_part2, uint8 *img, uint8* alphaimg, int width, int height, int startx, int starty, int channelsRGB)
{
	int diffbit;
	signed char color1[3];
	signed char diff[3];
	signed char red, green, blue;
  int channelsA;	

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alphaimg = &img[0+3];
  }

	diffbit = (GETBITSHIGH(block_part1, 1, 33));

	if( diffbit )
	{
		// We have diffbit = 1, meaning no transparent pixels. regular decompression.

		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];

		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59Tc(block59_part1, block59_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if (green < 0 || green > 31)
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58Hc(block58_part1, block58_part2, img, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
		}
		else
		{
 			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		for(int x=startx; x<startx+4; x++) 
		{
			for(int y=starty; y<starty+4; y++) 
			{
				alphaimg[channelsA*(x+y*width)]=255;
			}
		}
	}
	else
	{
		// We have diffbit = 0, transparent pixels. Only T-, H- or regular diff-mode possible.
		
		// Base color
		color1[0]= GETBITSHIGH(block_part1, 5, 63);
		color1[1]= GETBITSHIGH(block_part1, 5, 55);
		color1[2]= GETBITSHIGH(block_part1, 5, 47);

		// Diff color
		diff[0]= GETBITSHIGH(block_part1, 3, 58);
		diff[1]= GETBITSHIGH(block_part1, 3, 50);
		diff[2]= GETBITSHIGH(block_part1, 3, 42);

		// Extend sign bit to entire byte. 
		diff[0] = (diff[0] << 5);
		diff[1] = (diff[1] << 5);
		diff[2] = (diff[2] << 5);
		diff[0] = diff[0] >> 5;
		diff[1] = diff[1] >> 5;
		diff[2] = diff[2] >> 5;

		red   = color1[0] + diff[0];
		green = color1[1] + diff[1];
		blue  = color1[2] + diff[2];
		if(red < 0 || red > 31)
		{
			unsigned int block59_part1, block59_part2;
			unstuff59bits(block_part1, block_part2, block59_part1, block59_part2);
			decompressBlockTHUMB59TAlphaC(block59_part1, block59_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(green < 0 || green > 31) 
		{
			unsigned int block58_part1, block58_part2;
			unstuff58bits(block_part1, block_part2, block58_part1, block58_part2);
			decompressBlockTHUMB58HAlphaC(block58_part1, block58_part2, img, alphaimg, width, height, startx, starty, channelsRGB);
		}
		else if(blue < 0 || blue > 31)
		{
			unsigned int block57_part1, block57_part2;

			unstuff57bits(block_part1, block_part2, block57_part1, block57_part2);
			decompressBlockPlanar57c(block57_part1, block57_part2, img, width, height, startx, starty, channelsRGB);
			for(int x=startx; x<startx+4; x++) 
			{
				for(int y=starty; y<starty+4; y++) 
				{
					alphaimg[channelsA*(x+y*width)]=255;
				}
			}
		}
		else
			decompressBlockDifferentialWithAlphaC(block_part1, block_part2, img,alphaimg, width, height, startx, starty, channelsRGB);
	}
}